

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_delay.c
# Opt level: O0

void * sigdelread_new(t_symbol *s,t_floatarg f)

{
  t_sigdelread *x_00;
  t_sigdelread *x;
  t_floatarg f_local;
  t_symbol *s_local;
  
  x_00 = (t_sigdelread *)pd_new(sigdelread_class);
  x_00->x_sym = s;
  x_00->x_sr = 1.0;
  x_00->x_n = 1.0;
  x_00->x_zerodel = 0;
  sigdelread_float(x_00,f);
  outlet_new((t_object *)x_00,&s_signal);
  return x_00;
}

Assistant:

static void *sigdelread_new(t_symbol *s, t_floatarg f)
{
    t_sigdelread *x = (t_sigdelread *)pd_new(sigdelread_class);
    x->x_sym = s;
    x->x_sr = 1;
    x->x_n = 1;
    x->x_zerodel = 0;
    sigdelread_float(x, f);
    outlet_new(&x->x_obj, &s_signal);
    return (x);
}